

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.hh
# Opt level: O3

string * OB::Term::ANSI_Escape_Codes::fg_256(string *__return_storage_ptr__,string *str_)

{
  char *__nptr;
  int *piVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 uVar4;
  char *local_1c0;
  stringstream ss;
  ostream local_1b0 [112];
  ios_base local_140 [268];
  int local_34;
  
  __nptr = (str_->_M_dataplus)._M_p;
  piVar1 = __errno_location();
  local_34 = *piVar1;
  *piVar1 = 0;
  lVar2 = strtol(__nptr,&local_1c0,10);
  if (local_1c0 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)(uint)lVar2 == lVar2) && (*piVar1 != 0x22)) {
    if (*piVar1 == 0) {
      *piVar1 = local_34;
    }
    if ((uint)lVar2 < 0x101) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1b0,esc_abi_cxx11_,DAT_00132848);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[38;5;",6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(str_->_M_dataplus)._M_p,str_->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"m",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c0);
      std::ios_base::~ios_base(local_140);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    return __return_storage_ptr__;
  }
  uVar4 = std::__throw_out_of_range("stoi");
  if (*piVar1 == 0) {
    *piVar1 = local_34;
  }
  _Unwind_Resume(uVar4);
}

Assistant:

inline std::string fg_256(std::string const& str_)
{
  auto const n = std::stoi(str_);
  if (n < 0 || n > 256) return {};
  std::stringstream ss;
  ss << esc << "[38;5;" << str_ << "m";

  return ss.str();
}